

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

double __thiscall ON_Sun::CImpl::Azimuth(CImpl *this)

{
  bool bVar1;
  wchar_t *path_to_node;
  ON_XMLVariant local_208;
  ON_XMLVariant local_110;
  CImpl *local_18;
  CImpl *this_local;
  
  local_18 = this;
  bVar1 = IsUsingManualControl(this);
  if (bVar1) {
    path_to_node = XMLPath_Sun();
    ::ON_XMLVariant::ON_XMLVariant(&local_208,0.0);
    ON_InternalXMLImpl::GetParameter
              (&local_110,&this->super_ON_InternalXMLImpl,path_to_node,L"sun-azimuth",&local_208);
    this_local = (CImpl *)::ON_XMLVariant::AsDouble(&local_110);
    ::ON_XMLVariant::~ON_XMLVariant(&local_110);
    ::ON_XMLVariant::~ON_XMLVariant(&local_208);
  }
  else {
    UpdateAziAlt(this);
    this_local = (CImpl *)this->_azimuth;
  }
  return (double)this_local;
}

Assistant:

double ON_Sun::CImpl::Azimuth(void) const
{
  if (IsUsingManualControl())
    return GetParameter(XMLPath_Sun(), ON_RDK_SUN_AZIMUTH, 0.0).AsDouble();

  UpdateAziAlt();

  return _azimuth;
}